

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (string_t *ldata,timestamp_t *rdata,timestamp_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  string_t left;
  string_t left_00;
  bool bVar1;
  timestamp_t tVar2;
  idx_t iVar3;
  idx_t *piVar4;
  idx_t iVar5;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  timestamp_t rentry_1;
  string_t lentry_1;
  idx_t i_1;
  timestamp_t rentry;
  string_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff28;
  long lVar6;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  idx_t in_stack_ffffffffffffff40;
  ValidityMask *in_stack_ffffffffffffff48;
  timestamp_t in_stack_ffffffffffffff50;
  undefined1 fun_00;
  timestamp_t in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  ValidityMask *mask;
  ulong local_90;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_90 = 0; fun_00 = (undefined1)((ulong)in_stack_ffffffffffffff50.value >> 0x38),
        local_90 < in_R9; local_90 = local_90 + 1) {
      lVar6 = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_90);
      piVar4 = (idx_t *)(lVar6 + iVar3 * 0x10);
      iVar3 = *piVar4;
      mask = (ValidityMask *)piVar4[1];
      lVar6 = in_RSI;
      iVar5 = SelectionVector::get_index(in_R8,local_90);
      left_00.value.pointer.ptr = (char *)mask;
      left_00.value._0_8_ = iVar3;
      in_stack_ffffffffffffff50 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                     ((bool)fun_00,left_00,*(int64_t *)(lVar6 + iVar5 * 8),mask,iVar3);
      *(int64_t *)(in_RDX + local_90 * 8) = in_stack_ffffffffffffff50.value;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30), bVar1)) {
        left.value.pointer.ptr = (char *)in_stack_ffffffffffffff68;
        left.value._0_8_ = in_stack_ffffffffffffff60;
        tVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                          (SUB81((ulong)in_stack_ffffffffffffff50.value >> 0x38,0),left,
                           in_stack_ffffffffffffff58,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40);
        *(int64_t *)(in_RDX + local_40 * 8) = tVar2.value;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}